

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O2

void __thiscall QTextHtmlExporter::emitFrame(QTextHtmlExporter *this,Iterator *frameIt)

{
  QTextFrame *pQVar1;
  bool bVar2;
  QTextTable *table;
  QTextFrame *pQVar3;
  QTextFrame *f;
  long in_FS_OFFSET;
  QTextBlock local_70;
  iterator local_60;
  iterator local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((frameIt->cf != (QTextFrame *)0x0) || (frameIt->cb != frameIt->e)) {
    local_48.f = frameIt->f;
    local_48.b = frameIt->b;
    local_48.e = frameIt->e;
    local_48.cf = frameIt->cf;
    local_48.cb = frameIt->cb;
    local_48._28_4_ = *(undefined4 *)&frameIt->field_0x1c;
    QTextFrame::iterator::operator++(&local_48);
    if (((QObject *)local_48.cf == (QObject *)0x0) &&
       ((local_48.cb == local_48.e && (frameIt->cf == (QTextFrame *)0x0)))) {
      pQVar1 = frameIt->f;
      pQVar3 = QTextDocument::rootFrame(this->doc);
      if (pQVar1 != pQVar3) {
        QTextFrame::iterator::currentBlock(frameIt);
        QTextBlock::begin(&local_60,&local_70);
        if (local_60.n == local_60.e) goto LAB_00453a32;
      }
    }
  }
  local_48.f = frameIt->f;
  local_48.b = frameIt->b;
  local_48.e = frameIt->e;
  local_48.cf = frameIt->cf;
  local_48.cb = frameIt->cb;
  local_48._28_4_ = *(undefined4 *)&frameIt->field_0x1c;
  while ((pQVar1 = local_48.cf, (QObject *)local_48.cf != (QObject *)0x0 ||
         (local_48.cb != local_48.e))) {
    if ((QObject *)local_48.cf == (QObject *)0x0) {
      QTextFrame::iterator::currentBlock(&local_48);
      bVar2 = QTextBlock::isValid((QTextBlock *)&local_60);
      if (bVar2) {
        QTextFrame::iterator::currentBlock(&local_48);
        emitBlock(this,(QTextBlock *)&local_60);
      }
    }
    else {
      table = QtPrivate::qobject_cast_helper<QTextTable*,QObject>((QObject *)local_48.cf);
      if (table == (QTextTable *)0x0) {
        emitTextFrame(this,pQVar1);
      }
      else {
        emitTable(this,table);
      }
    }
    QTextFrame::iterator::operator++(&local_48);
  }
LAB_00453a32:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextHtmlExporter::emitFrame(const QTextFrame::Iterator &frameIt)
{
    if (!frameIt.atEnd()) {
        QTextFrame::Iterator next = frameIt;
        ++next;
        if (next.atEnd()
            && frameIt.currentFrame() == nullptr
            && frameIt.parentFrame() != doc->rootFrame()
            && frameIt.currentBlock().begin().atEnd())
            return;
    }

    for (QTextFrame::Iterator it = frameIt;
         !it.atEnd(); ++it) {
        if (QTextFrame *f = it.currentFrame()) {
            if (QTextTable *table = qobject_cast<QTextTable *>(f)) {
                emitTable(table);
            } else {
                emitTextFrame(f);
            }
        } else if (it.currentBlock().isValid()) {
            emitBlock(it.currentBlock());
        }
    }
}